

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_x86_mov64FromMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,
               sysbvm_x86_register_t source,int32_t offset)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  undefined1 uVar2;
  undefined1 uVar3;
  byte bVar4;
  size_t byteCount;
  uint8_t instruction [4];
  undefined8 local_8;
  
  bVar4 = (byte)destination;
  local_8._3_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  if (source == SYSBVM_X86_EBP || offset != 0) {
    uVar3 = (undefined1)((uint)offset >> 8);
    uVar2 = (undefined1)((uint)offset >> 0x18);
    uVar1 = (undefined1)((uint)offset >> 0x10);
    if ((source & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      local_8._0_3_ = CONCAT12((bVar4 & 7) << 3,0x8b48) | 0x840000;
      local_8._0_4_ = CONCAT13(0x24,(uint3)local_8);
      local_8 = CONCAT17(uVar2,CONCAT16(uVar1,CONCAT15(uVar3,CONCAT14((char)offset,
                                                                      (undefined4)local_8))));
      byteCount = 8;
    }
    else {
      local_8._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
      local_8 = CONCAT17(local_8._7_1_,
                         CONCAT16(uVar2,CONCAT15(uVar1,CONCAT14(uVar3,CONCAT13((char)offset,
                                                                               CONCAT12((bVar4 & 7)
                                                                                        << 3 | (byte
                                                  )source & 7,0x8b48)))))) | 0x800000;
      byteCount = 7;
    }
  }
  else if ((source & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
    local_8._0_3_ = CONCAT12((bVar4 & 7) << 3,0x8b48) | 0x40000;
    local_8._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    local_8._0_4_ = CONCAT13(0x24,(uint3)local_8);
    byteCount = 4;
  }
  else {
    local_8._0_3_ = CONCAT12((bVar4 & 7) << 3 | (byte)source & 7,0x8b48);
    byteCount = 3;
  }
  sysbvm_bytecodeJit_addBytes(jit,byteCount,(uint8_t *)&local_8);
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64FromMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, sysbvm_x86_register_t source, int32_t offset)
{
    if(offset == 0 && source != SYSBVM_X86_RBP)
    {
        if((source & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 0),
                sysbvm_jit_x86_sibOnlyBase(source),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
    else
    {
        if((source & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 2),
                sysbvm_jit_x86_sibOnlyBase(source),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, destination > SYSBVM_X86_REG_HALF_MASK, false, source > SYSBVM_X86_REG_HALF_MASK),
                0x8B,
                sysbvm_jit_x86_modRM(source, destination, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}